

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# splay.c
# Opt level: O2

int Curl_splayremove(Curl_tree *t,Curl_tree *removenode,Curl_tree **newroot)

{
  curltime *pcVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  Curl_tree *pCVar6;
  int iVar7;
  undefined4 uVar8;
  Curl_tree *pCVar9;
  curltime i;
  curltime i_00;
  
  if (removenode == (Curl_tree *)0x0 || t == (Curl_tree *)0x0) {
    return 1;
  }
  pcVar1 = &removenode->key;
  uVar2 = pcVar1->tv_sec;
  uVar3 = pcVar1->tv_usec;
  i.tv_usec = uVar3;
  i.tv_sec = uVar2;
  if ((removenode->key).tv_usec == -1 && pcVar1->tv_sec == -1) {
    if (removenode->samen == removenode) {
      return 3;
    }
    pCVar9 = removenode->samep;
    pCVar9->samen = removenode->samen;
    removenode->samen->samep = pCVar9;
    removenode->samen = removenode;
  }
  else {
    i._12_4_ = 0;
    pCVar9 = Curl_splay(i,t);
    if (pCVar9 != removenode) {
      return 2;
    }
    t = pCVar9->samen;
    if (t == removenode) {
      if (pCVar9->smaller == (Curl_tree *)0x0) {
        t = pCVar9->larger;
      }
      else {
        uVar4 = (removenode->key).tv_sec;
        uVar5 = (removenode->key).tv_usec;
        i_00.tv_usec = uVar5;
        i_00.tv_sec = uVar4;
        i_00._12_4_ = 0;
        t = Curl_splay(i_00,pCVar9->smaller);
        t->larger = pCVar9->larger;
      }
    }
    else {
      iVar7 = (pCVar9->key).tv_usec;
      uVar8 = *(undefined4 *)&(pCVar9->key).field_0xc;
      (t->key).tv_sec = (pCVar9->key).tv_sec;
      (t->key).tv_usec = iVar7;
      *(undefined4 *)&(t->key).field_0xc = uVar8;
      pCVar6 = pCVar9->larger;
      t->smaller = pCVar9->smaller;
      t->larger = pCVar6;
      pCVar9 = pCVar9->samep;
      t->samep = pCVar9;
      pCVar9->samen = t;
    }
  }
  *newroot = t;
  return 0;
}

Assistant:

int Curl_splayremove(struct Curl_tree *t,
                     struct Curl_tree *removenode,
                     struct Curl_tree **newroot)
{
  static const struct curltime KEY_NOTUSED = {
    ~0, -1
  }; /* will *NEVER* appear */
  struct Curl_tree *x;

  if(!t || !removenode)
    return 1;

  if(compare(KEY_NOTUSED, removenode->key) == 0) {
    /* Key set to NOTUSED means it is a subnode within a 'same' linked list
       and thus we can unlink it easily. */
    if(removenode->samen == removenode)
      /* A non-subnode should never be set to KEY_NOTUSED */
      return 3;

    removenode->samep->samen = removenode->samen;
    removenode->samen->samep = removenode->samep;

    /* Ensures that double-remove gets caught. */
    removenode->samen = removenode;

    *newroot = t; /* return the same root */
    return 0;
  }

  t = Curl_splay(removenode->key, t);

  /* First make sure that we got the same root node as the one we want
     to remove, as otherwise we might be trying to remove a node that
     isn't actually in the tree.

     We cannot just compare the keys here as a double remove in quick
     succession of a node with key != KEY_NOTUSED && same != NULL
     could return the same key but a different node. */
  if(t != removenode)
    return 2;

  /* Check if there is a list with identical sizes, as then we're trying to
     remove the root node of a list of nodes with identical keys. */
  x = t->samen;
  if(x != t) {
    /* 'x' is the new root node, we just make it use the root node's
       smaller/larger links */

    x->key = t->key;
    x->larger = t->larger;
    x->smaller = t->smaller;
    x->samep = t->samep;
    t->samep->samen = x;
  }
  else {
    /* Remove the root node */
    if(!t->smaller)
      x = t->larger;
    else {
      x = Curl_splay(removenode->key, t->smaller);
      x->larger = t->larger;
    }
  }

  *newroot = x; /* store new root pointer */

  return 0;
}